

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-input.c
# Opt level: O0

fy_input * fy_input_from_data(char *data,size_t size,fy_atom *handle,_Bool simple)

{
  fy_input *fyi;
  _Bool simple_local;
  fy_atom *handle_local;
  size_t size_local;
  char *data_local;
  
  handle_local = (fy_atom *)size;
  if ((data != (char *)0x0) && (size == 0xffffffffffffffff)) {
    handle_local = (fy_atom *)strlen(data);
  }
  data_local = (char *)fy_input_alloc();
  if ((fy_input *)data_local == (fy_input *)0x0) {
    data_local = (char *)0x0;
  }
  else {
    (((fy_input *)data_local)->cfg).type = fyit_memory;
    (((fy_input *)data_local)->cfg).userdata = (void *)0x0;
    (((fy_input *)data_local)->cfg).field_2.stream.name = data;
    (((fy_input *)data_local)->cfg).field_2.stream.fp = (FILE *)handle_local;
    fy_input_from_data_setup((fy_input *)data_local,handle,simple);
  }
  return (fy_input *)data_local;
}

Assistant:

struct fy_input *fy_input_from_data(const char *data, size_t size,
                                    struct fy_atom *handle, bool simple) {
    struct fy_input *fyi;

    if (data && size == (size_t) -1)
        size = strlen(data);

    fyi = fy_input_alloc();
    if (!fyi)
        return NULL;

    fyi->cfg.type = fyit_memory;
    fyi->cfg.userdata = NULL;
    fyi->cfg.memory.data = data;
    fyi->cfg.memory.size = size;

    fy_input_from_data_setup(fyi, handle, simple);

    return fyi;
}